

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O0

int __thiscall AGSSock::AGSSockData::Dispose(AGSSockData *this,char *data,bool force)

{
  bool force_local;
  char *data_local;
  AGSSockData *this_local;
  
  if (data != (char *)0x0) {
    SockData::~SockData((SockData *)data);
    operator_delete(data,0x20);
  }
  return 1;
}

Assistant:

int AGSSockData::Dispose(const char *data, bool force)
{
	delete (SockData *) data;
	return 1;
}